

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# path.cpp
# Opt level: O0

bool libtorrent::path_equal(string *lhs,string *rhs)

{
  int iVar1;
  ulong uVar2;
  char *pcVar3;
  long lVar4;
  undefined8 local_38;
  size_type rhs_size;
  size_type lhs_size;
  string *rhs_local;
  string *lhs_local;
  
  uVar2 = ::std::__cxx11::string::empty();
  if ((uVar2 & 1) == 0) {
    ::std::__cxx11::string::size();
    pcVar3 = (char *)::std::__cxx11::string::operator[]((ulong)lhs);
    if (*pcVar3 != '/') goto LAB_00436ac9;
    lVar4 = ::std::__cxx11::string::size();
    local_38 = (string *)(lVar4 + -1);
  }
  else {
LAB_00436ac9:
    local_38 = (string *)::std::__cxx11::string::size();
  }
  uVar2 = ::std::__cxx11::string::empty();
  if ((uVar2 & 1) == 0) {
    ::std::__cxx11::string::size();
    pcVar3 = (char *)::std::__cxx11::string::operator[]((ulong)rhs);
    if (*pcVar3 == '/') {
      ::std::__cxx11::string::size();
      goto LAB_00436b34;
    }
  }
  ::std::__cxx11::string::size();
LAB_00436b34:
  iVar1 = ::std::__cxx11::string::compare((ulong)lhs,0,local_38,(ulong)rhs,0);
  return iVar1 == 0;
}

Assistant:

bool path_equal(std::string const& lhs, std::string const& rhs)
	{
		std::string::size_type const lhs_size = !lhs.empty()
			&& (lhs[lhs.size()-1] == '/'
#if defined(TORRENT_WINDOWS) || defined(TORRENT_OS2)
			|| lhs[lhs.size()-1] == '\\'
#endif
			) ? lhs.size() - 1 : lhs.size();

		std::string::size_type const rhs_size = !rhs.empty()
			&& (rhs[rhs.size()-1] == '/'
#if defined(TORRENT_WINDOWS) || defined(TORRENT_OS2)
			|| rhs[rhs.size()-1] == '\\'
#endif
			) ? rhs.size() - 1 : rhs.size();
		return lhs.compare(0, lhs_size, rhs, 0, rhs_size) == 0;
	}